

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergePartialFromCodedStream
          (DescriptorProto_ExtensionRange *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  undefined8 in_RAX;
  uint32 tag;
  undefined8 local_38;
  
  local_38 = in_RAX;
LAB_001e7d29:
  do {
    while( true ) {
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar1 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      if (tag >> 3 != 2) break;
      if ((tag & 7) != 0) goto LAB_001e7d97;
LAB_001e7dfb:
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (-1 < (char)*puVar1)) {
        local_38 = CONCAT44(local_38._4_4_,(int)(char)*puVar1);
        input->buffer_ = puVar1 + 1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_38);
        if (!bVar2) {
          return false;
        }
      }
      this->end_ = (uint32)local_38;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if ((input->buffer_ == input->buffer_end_) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
    if ((tag >> 3 == 1) && ((tag & 7) == 0)) {
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (-1 < (char)*puVar1)) {
        local_38 = CONCAT44((int)(char)*puVar1,(uint32)local_38);
        input->buffer_ = puVar1 + 1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)((long)&local_38 + 4));
        if (!bVar2) {
          return false;
        }
      }
      this->start_ = local_38._4_4_;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x10')) {
        input->buffer_ = puVar1 + 1;
        goto LAB_001e7dfb;
      }
      goto LAB_001e7d29;
    }
LAB_001e7d97:
    if ((tag & 7) == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto_ExtensionRange::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 start = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &start_)));
          set_has_start();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_end;
        break;
      }

      // optional int32 end = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_end:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &end_)));
          set_has_end();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}